

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upgrade_proto.cpp
# Opt level: O2

void caffe::UpgradeV0PaddingLayers(NetParameter *param,NetParameter *param_upgraded_pad)

{
  RepeatedPtrField<caffe::V1LayerParameter> *this;
  uint32 uVar1;
  bool bVar2;
  Type *pTVar3;
  mapped_type_conflict1 *pmVar4;
  Type *from;
  V0LayerParameter *pVVar5;
  V1LayerParameter *this_00;
  iterator iVar6;
  ostream *poVar7;
  Type *pTVar8;
  V0LayerParameter *pVVar9;
  Type *pTVar10;
  V0LayerParameter *pVVar11;
  int i;
  int iVar12;
  int index;
  int j;
  int iVar13;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  blob_name_to_last_top_idx;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_80;
  string local_50 [32];
  
  NetParameter::Clear(param_upgraded_pad);
  NetParameter::CopyFrom(param_upgraded_pad,param);
  this = &param_upgraded_pad->layers_;
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<caffe::V1LayerParameter>::TypeHandler>
            (&this->super_RepeatedPtrFieldBase);
  local_80._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_80._M_impl.super__Rb_tree_header._M_header;
  local_80._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_80._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_80._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_80._M_impl.super__Rb_tree_header._M_header._M_right =
       local_80._M_impl.super__Rb_tree_header._M_header._M_left;
  for (iVar12 = 0; iVar12 < (param->input_).super_RepeatedPtrFieldBase.current_size_;
      iVar12 = iVar12 + 1) {
    pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&(param->input_).super_RepeatedPtrFieldBase,iVar12);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                           *)&local_80,pTVar3);
    *pmVar4 = -1;
  }
  for (iVar12 = 0; iVar12 < (param->layers_).super_RepeatedPtrFieldBase.current_size_;
      iVar12 = iVar12 + 1) {
    from = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<caffe::V1LayerParameter>::TypeHandler>
                     (&(param->layers_).super_RepeatedPtrFieldBase,iVar12);
    pVVar5 = from->layer_;
    if (pVVar5 == (V0LayerParameter *)0x0) {
      pVVar5 = (V0LayerParameter *)&_V0LayerParameter_default_instance_;
    }
    bVar2 = std::operator!=((pVVar5->type_).ptr_,"padding");
    if (bVar2) {
      this_00 = google::protobuf::RepeatedPtrField<caffe::V1LayerParameter>::Add(this);
      V1LayerParameter::CopyFrom(this_00,from);
    }
    for (iVar13 = 0; iVar13 < (from->bottom_).super_RepeatedPtrFieldBase.current_size_;
        iVar13 = iVar13 + 1) {
      pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&(from->bottom_).super_RepeatedPtrFieldBase,iVar13);
      iVar6 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ::find(&local_80,pTVar3);
      if ((_Rb_tree_header *)iVar6._M_node == &local_80._M_impl.super__Rb_tree_header) {
        poVar7 = std::operator<<((ostream *)&std::cerr,"Unknown blob input ");
        poVar7 = std::operator<<(poVar7,(string *)pTVar3);
        poVar7 = std::operator<<(poVar7," to layer ");
        std::ostream::operator<<((ostream *)poVar7,iVar13);
      }
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                             *)&local_80,pTVar3);
      if (*pmVar4 != -1) {
        pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<caffe::V1LayerParameter>::TypeHandler>
                           (&(param->layers_).super_RepeatedPtrFieldBase,*pmVar4);
        pVVar9 = pTVar8->layer_;
        if (pVVar9 == (V0LayerParameter *)0x0) {
          pVVar9 = (V0LayerParameter *)&_V0LayerParameter_default_instance_;
        }
        bVar2 = std::operator==((pVVar9->type_).ptr_,"padding");
        if (bVar2) {
          std::__cxx11::string::string(local_50,(string *)(pVVar5->type_).ptr_);
          std::__cxx11::string::~string(local_50);
          index = (param_upgraded_pad->layers_).super_RepeatedPtrFieldBase.current_size_ + -1;
          pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                    Mutable<google::protobuf::RepeatedPtrField<caffe::V1LayerParameter>::TypeHandler>
                              (&this->super_RepeatedPtrFieldBase,index);
          pVVar11 = V1LayerParameter::mutable_layer(pTVar10);
          pVVar9 = pTVar8->layer_;
          if (pVVar9 == (V0LayerParameter *)0x0) {
            pVVar9 = (V0LayerParameter *)&_V0LayerParameter_default_instance_;
          }
          uVar1 = pVVar9->pad_;
          (pVVar11->_has_bits_).has_bits_[0] = (pVVar11->_has_bits_).has_bits_[0] | 0x200;
          pVVar11->pad_ = uVar1;
          pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                    Mutable<google::protobuf::RepeatedPtrField<caffe::V1LayerParameter>::TypeHandler>
                              (&this->super_RepeatedPtrFieldBase,index);
          pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                             (&(pTVar8->bottom_).super_RepeatedPtrFieldBase,0);
          V1LayerParameter::set_bottom(pTVar10,iVar13,pTVar3);
        }
      }
    }
    for (iVar13 = 0; iVar13 < (from->top_).super_RepeatedPtrFieldBase.current_size_;
        iVar13 = iVar13 + 1) {
      pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&(from->top_).super_RepeatedPtrFieldBase,iVar13);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                             *)&local_80,pTVar3);
      *pmVar4 = iVar12;
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&local_80);
  return;
}

Assistant:

void UpgradeV0PaddingLayers(const NetParameter& param,
                            NetParameter* param_upgraded_pad) {
  // Copy everything other than the layers from the original param.
  param_upgraded_pad->Clear();
  param_upgraded_pad->CopyFrom(param);
  param_upgraded_pad->clear_layers();
  // Figure out which layer each bottom blob comes from.
  map<string, int> blob_name_to_last_top_idx;
  for (int i = 0; i < param.input_size(); ++i) {
    const string& blob_name = param.input(i);
    blob_name_to_last_top_idx[blob_name] = -1;
  }
  for (int i = 0; i < param.layers_size(); ++i) {
    const V1LayerParameter& layer_connection = param.layers(i);
    const V0LayerParameter& layer_param = layer_connection.layer();
    // Add the layer to the new net, unless it's a padding layer.
    if (layer_param.type() != "padding") {
      param_upgraded_pad->add_layers()->CopyFrom(layer_connection);
    }
    for (int j = 0; j < layer_connection.bottom_size(); ++j) {
      const string& blob_name = layer_connection.bottom(j);
      if (blob_name_to_last_top_idx.find(blob_name) ==
          blob_name_to_last_top_idx.end()) {
        LOG(FATAL) << "Unknown blob input " << blob_name << " to layer " << j;
      }
      const int top_idx = blob_name_to_last_top_idx[blob_name];
      if (top_idx == -1) {
        continue;
      }
      const V1LayerParameter& source_layer = param.layers(top_idx);
      if (source_layer.layer().type() == "padding") {
        // This layer has a padding layer as input -- check that it is a conv
        // layer or a pooling layer and takes only one input.  Also check that
        // the padding layer input has only one input and one output.  Other
        // cases have undefined behavior in Caffe.
        CHECK((layer_param.type() == "conv") || (layer_param.type() == "pool"))
            << "Padding layer input to "
            "non-convolutional / non-pooling layer type "
            << layer_param.type();
        CHECK_EQ(layer_connection.bottom_size(), 1)
            << "Conv Layer takes a single blob as input.";
        CHECK_EQ(source_layer.bottom_size(), 1)
            << "Padding Layer takes a single blob as input.";
        CHECK_EQ(source_layer.top_size(), 1)
            << "Padding Layer produces a single blob as output.";
        int layer_index = param_upgraded_pad->layers_size() - 1;
        param_upgraded_pad->mutable_layers(layer_index)->mutable_layer()
            ->set_pad(source_layer.layer().pad());
        param_upgraded_pad->mutable_layers(layer_index)
            ->set_bottom(j, source_layer.bottom(0));
      }
    }
    for (int j = 0; j < layer_connection.top_size(); ++j) {
      const string& blob_name = layer_connection.top(j);
      blob_name_to_last_top_idx[blob_name] = i;
    }
  }
}